

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

bool arm::is_valid_immediate(uint32_t val)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = true;
  if (0xff < val) {
    dVar2 = log2((double)(-val & val));
    bVar1 = ((int)(dVar2 + 1.0) & 1U) == 0 &&
            (~(0xff << ((byte)(int)(dVar2 + 1.0) & 0x1f)) & val) == 0;
  }
  return bVar1;
}

Assistant:

bool is_valid_immediate(uint32_t val) {
  if (val <= 0xff)
    return true;
  else if (val <= 0x00ffffff) {
    int highest_bit = log2(val & -val) + 1;
    return (val & ~(0xff << highest_bit)) == 0 && highest_bit % 2 == 0;
  } else {
    val = prelude::rotl32(val, 8);
    int highest_bit = log2(val & -val) + 1;
    return (val & ~(0xff << highest_bit)) == 0 && highest_bit % 2 == 0;
  }
}